

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RDLdimacs.c
# Opt level: O3

RDL_DimacsGraph * RDL_dimacsGraph_read(char *filename)

{
  uint uVar1;
  RDL_node RVar2;
  RDL_node RVar3;
  bool bVar4;
  int iVar5;
  FILE *__stream;
  RDL_DimacsGraph *graph;
  char *pcVar6;
  RDL_edge *paRVar7;
  RDL_cycle **ppRVar8;
  size_t sVar9;
  RDL_cycle *pRVar10;
  char **__base;
  ulong uVar11;
  uint *puVar12;
  ulong uVar13;
  ulong uVar14;
  uint uVar15;
  uint uVar16;
  ulong uVar17;
  uint node2;
  uint node1;
  uint ring;
  uint ring_size;
  char line [257];
  uint local_17c;
  RDL_node local_178;
  uint local_174;
  uint local_170;
  uint local_16c;
  uint local_168;
  uint local_164;
  uint *local_160;
  FILE *local_158;
  ulong local_150;
  uint *local_148;
  uint *local_140;
  byte local_138 [2];
  char local_136 [262];
  
  local_164 = 0;
  __stream = fopen(filename,"r");
  uVar13 = 0;
  if (__stream == (FILE *)0x0) {
    return (RDL_DimacsGraph *)0x0;
  }
  graph = (RDL_DimacsGraph *)malloc(0x30);
  local_160 = &graph->nof_cycles;
  graph->nof_cycles = 0;
  graph->name = (char *)0x0;
  graph->edges = (RDL_edge *)0x0;
  graph->cycles = (RDL_cycle **)0x0;
  graph->sorted_cycles = (char **)0x0;
  pcVar6 = fgets((char *)local_138,0x100,__stream);
  local_17c = 0;
  uVar15 = 0;
  uVar16 = 0;
  if (pcVar6 != (char *)0x0) {
    puVar12 = &graph->nof_nodes;
    local_148 = &graph->nof_edges;
    uVar13 = 0;
    local_17c = 0;
    local_168 = 0;
    local_170 = 0;
    iVar5 = 0;
    local_158 = __stream;
    do {
      if (local_138[0] < 0x70) {
        if (local_138[0] != 99) {
          if (local_138[0] == 0x65) {
            if (iVar5 == 1) {
              iVar5 = __isoc99_sscanf(local_138,"e %u %u",&local_174,&local_178);
              if (iVar5 == 0) {
                pcVar6 = "invalid edge specification line\n";
              }
              else if (local_170 == *local_148) {
                pcVar6 = "too many edges found!\n";
              }
              else {
                if (((local_174 != 0) && (local_174 <= *puVar12)) && (local_178 - 1 < *puVar12)) {
                  paRVar7 = graph->edges;
                  paRVar7[local_170][0] = local_174;
                  paRVar7[local_170][1] = local_178;
                  local_170 = local_170 + 1;
                  goto LAB_0010d9f1;
                }
LAB_0010dc8f:
                pcVar6 = "illegal edge specification!\n";
              }
            }
            else {
              pcVar6 = "edge \'e\' found without \'p\' definition!\n";
            }
          }
          else {
LAB_0010dce3:
            pcVar6 = "invalid line!\n";
          }
          goto LAB_0010dd68;
        }
        local_150 = uVar13;
        sVar9 = strlen((char *)local_138);
        bVar4 = true;
        uVar13 = local_150;
        if ((sVar9 & 0xfffffffc) != 0 && graph->name == (char *)0x0) {
          pcVar6 = (char *)malloc((ulong)((int)sVar9 - 2));
          graph->name = pcVar6;
          uVar13 = (ulong)((int)sVar9 - 3);
          strncpy(pcVar6,local_136,uVar13);
          pcVar6[uVar13] = '\0';
          uVar13 = local_150;
          __stream = local_158;
        }
      }
      else {
        if (local_138[0] == 0x72) {
          if (iVar5 == 0) {
            pcVar6 = "ring \'r\' found without \'p\' definition!\n";
LAB_0010dd68:
            (*RDL_outputFunc)(RDL_ERROR,pcVar6);
          }
          else {
            if (graph->cycles == (RDL_cycle **)0x0) {
              pcVar6 = "ring \'r\' found without \'p\' definition for rings!\n";
              goto LAB_0010dd68;
            }
            iVar5 = __isoc99_sscanf(local_138,"r %u %u %u %u",&local_16c,&local_164,&local_174,
                                    &local_178);
            if (iVar5 != 4) {
              pcVar6 = "invalid ring specification line\n";
              goto LAB_0010dd68;
            }
            if ((local_16c == 0) || (*local_160 < local_16c)) {
              (*RDL_outputFunc)(RDL_ERROR,"invalid ring counter \'%u\'!\n");
            }
            else {
              if (((local_174 == 0) || (*puVar12 < local_174)) || (*puVar12 <= local_178 - 1))
              goto LAB_0010dc8f;
              uVar15 = (uint)uVar13;
              if (local_16c == uVar15) {
                ppRVar8 = graph->cycles;
                uVar17 = (ulong)(uVar15 - 1);
                bVar4 = true;
              }
              else {
                bVar4 = true;
                local_140 = puVar12;
                if (uVar15 != 0) {
                  if (local_17c == graph->cycles[uVar15 - 1]->weight) {
                    if (local_16c != uVar15 + 1) {
                      bVar4 = false;
                      (*RDL_outputFunc)(RDL_ERROR,
                                        "rings have to be continuous, \'%u\' follows on \'%u\'",
                                        (ulong)local_16c,uVar13 & 0xffffffff);
                    }
                  }
                  else {
                    bVar4 = false;
                    (*RDL_outputFunc)(RDL_ERROR,"last ring %u wasn\'t filled up!\n",
                                      uVar13 & 0xffffffff);
                  }
                }
                pRVar10 = (RDL_cycle *)malloc(0x18);
                uVar13 = (ulong)local_16c;
                uVar17 = (ulong)(local_16c - 1);
                graph->cycles[uVar17] = pRVar10;
                ppRVar8 = graph->cycles;
                pRVar10 = ppRVar8[uVar17];
                pRVar10->weight = local_164;
                paRVar7 = (RDL_edge *)malloc((ulong)local_164 << 3);
                pRVar10->edges = paRVar7;
                local_168 = local_168 + 1;
                local_17c = 0;
                puVar12 = local_140;
              }
              if (local_17c != ppRVar8[uVar17]->weight) {
                ppRVar8[uVar17]->edges[local_17c][0] = local_174;
                ppRVar8[local_16c - 1]->edges[local_17c][1] = local_178;
                local_17c = local_17c + 1;
                iVar5 = 2;
                __stream = local_158;
                goto LAB_0010daea;
              }
              (*RDL_outputFunc)(RDL_ERROR,"too many edges for ring!\n");
              __stream = local_158;
            }
          }
          fgets((char *)local_138,0x100,__stream);
          goto LAB_0010dd8a;
        }
        if (local_138[0] != 0x70) goto LAB_0010dce3;
        if (iVar5 != 0) {
          pcVar6 = "duplicate \'p\' line found!\n";
          goto LAB_0010dd68;
        }
        iVar5 = __isoc99_sscanf(local_138,"p edge %u %u %u",puVar12,local_148);
        if (iVar5 == 2) {
          paRVar7 = (RDL_edge *)malloc((ulong)graph->nof_edges << 3);
          graph->edges = paRVar7;
          graph->nof_cycles = 0xffffffff;
          graph->cycles = (RDL_cycle **)0x0;
        }
        else {
          if (iVar5 != 3) {
            pcVar6 = "invalid line starting with \'p\'\n";
            goto LAB_0010dd68;
          }
          paRVar7 = (RDL_edge *)malloc((ulong)graph->nof_edges << 3);
          graph->edges = paRVar7;
          ppRVar8 = (RDL_cycle **)calloc(1,(ulong)graph->nof_cycles << 3);
          graph->cycles = ppRVar8;
        }
LAB_0010d9f1:
        bVar4 = true;
        iVar5 = 1;
      }
LAB_0010daea:
      pcVar6 = fgets((char *)local_138,0x100,__stream);
    } while ((bVar4) && (pcVar6 != (char *)0x0));
    uVar15 = local_170;
    uVar16 = local_168;
    if (!bVar4) goto LAB_0010dd8a;
  }
  uVar1 = *local_160;
  if (uVar1 != 0xffffffff) {
    if (uVar16 != uVar1) {
      (*RDL_outputFunc)(RDL_ERROR,"mismatch between number of cycles!\n");
    }
    if (((int)uVar13 != 0) && (local_17c != graph->cycles[(int)uVar13 - 1]->weight)) {
      (*RDL_outputFunc)(RDL_ERROR,"last ring %u wasn\'t filled up!\n",uVar13 & 0xffffffff);
      goto LAB_0010dd8a;
    }
    if (uVar16 != uVar1) goto LAB_0010dd8a;
  }
  if (uVar15 == graph->nof_edges) {
    fclose(__stream);
    if (graph->cycles == (RDL_cycle **)0x0) {
      graph->sorted_cycles = (char **)0x0;
      return graph;
    }
    uVar15 = graph->nof_cycles;
    __base = (char **)malloc((ulong)uVar15 * 8);
    graph->sorted_cycles = __base;
    if ((ulong)uVar15 == 0) {
      sVar9 = 0;
    }
    else {
      uVar13 = 0xffffffff;
      uVar17 = 0;
      do {
        uVar15 = graph->nof_edges;
        pcVar6 = (char *)malloc((ulong)(uVar15 + 1));
        graph->sorted_cycles[uVar17] = pcVar6;
        memset(graph->sorted_cycles[uVar17],0,(ulong)uVar15);
        graph->sorted_cycles[uVar17][graph->nof_edges] = '\x02';
        pRVar10 = graph->cycles[uVar17];
        if (pRVar10->weight != 0) {
          uVar11 = 0;
          do {
            if ((ulong)graph->nof_edges != 0) {
              RVar2 = pRVar10->edges[uVar11][0];
              RVar3 = pRVar10->edges[uVar11][1];
              paRVar7 = graph->edges;
              uVar14 = 0;
              do {
                if (((paRVar7[uVar14][0] == RVar2) && (paRVar7[uVar14][1] == RVar3)) ||
                   ((paRVar7[uVar14][0] == RVar3 && (paRVar7[uVar14][1] == RVar2)))) {
                  uVar13 = uVar14 & 0xffffffff;
                }
                uVar14 = uVar14 + 1;
              } while (graph->nof_edges != uVar14);
            }
            graph->sorted_cycles[uVar17][(int)uVar13] = '\x01';
            uVar11 = uVar11 + 1;
            pRVar10 = graph->cycles[uVar17];
          } while (uVar11 < pRVar10->weight);
        }
        uVar17 = uVar17 + 1;
        sVar9 = (size_t)*local_160;
      } while (uVar17 < sVar9);
      __base = graph->sorted_cycles;
    }
    qsort(__base,sVar9,8,RDL_cmp_cycles);
    return graph;
  }
  (*RDL_outputFunc)(RDL_ERROR,"mismatch between number of edges!\n");
LAB_0010dd8a:
  RDL_dimacsGraph_delete(graph);
  fclose(__stream);
  return (RDL_DimacsGraph *)0x0;
}

Assistant:

RDL_DimacsGraph* RDL_dimacsGraph_read(const char* filename)
{
  FILE* infile;
  RDL_DimacsGraph* graph = NULL;
  char line[RDL_MAXSIZE + 1];
  unsigned node1, node2, ring;
  int error = 0;
  int stage = 0;
  unsigned edge_counter = 0;
  unsigned ring_counter = 0;
  unsigned ring_position_counter = 0;
  unsigned last_ring = 0;
  unsigned ring_size = 0;
  unsigned ring_idx, edge_idx;
  unsigned eidx;
  int found_eidx = -1;
  int read_initializer = -1;
  unsigned len;
  RDL_edge edge;

  infile = fopen(filename, "r");

  if (!infile) {
    return graph;
  }

  graph = malloc(sizeof(*graph));
  graph->nof_cycles = 0;
  graph->edges = NULL;
  graph->cycles = NULL;
  graph->sorted_cycles = NULL;
  graph->name = NULL;

  while (fgets(line, RDL_MAXSIZE, infile) && !error) {
    if (line[0] == 'p') {
      if (!stage) {
        stage = 1;

        read_initializer = sscanf(line, "p edge %u %u %u", &graph->nof_nodes, &graph->nof_edges, &graph->nof_cycles);
        if (read_initializer == 3) {
          graph->edges = malloc(graph->nof_edges * sizeof(*graph->edges));
          graph->cycles = malloc(graph->nof_cycles * sizeof(*graph->cycles));
          memset(graph->cycles, 0, graph->nof_cycles * sizeof(*graph->cycles));
        }
        else if (read_initializer == 2) {
          graph->edges = malloc(graph->nof_edges * sizeof(*graph->edges));
          graph->nof_cycles = UINT_MAX;
          graph->cycles = NULL;
        }
        else {
          RDL_outputFunc(RDL_ERROR, "invalid line starting with 'p'\n");
          error = 1;
        }
      }
      else {
        RDL_outputFunc(RDL_ERROR, "duplicate 'p' line found!\n");
        error = 1;
      }
    }
    else if (line[0] == 'e') {
      if (stage != 1) {
        RDL_outputFunc(RDL_ERROR, "edge 'e' found without 'p' definition!\n");
        error = 1;
      }
      else {
        if (!sscanf(line, "e %u %u", &node1, &node2)) {
          RDL_outputFunc(RDL_ERROR, "invalid edge specification line\n");
          error = 1;
        }
        else if (edge_counter == graph->nof_edges) {
          RDL_outputFunc(RDL_ERROR, "too many edges found!\n");
          error = 1;
        }
        else if (node1 < 1 || node1 > graph->nof_nodes || node2 < 1 || node2 > graph->nof_nodes) {
          RDL_outputFunc(RDL_ERROR, "illegal edge specification!\n");
          error = 1;
        }
        else {
          graph->edges[edge_counter][0] = node1;
          graph->edges[edge_counter][1] = node2;
          ++edge_counter;
        }
      }
    }
    else if (line[0] == 'r') {
      if (!stage) {
        RDL_outputFunc(RDL_ERROR, "ring 'r' found without 'p' definition!\n");
        error = 1;
      }
      else if (!graph->cycles) {
        RDL_outputFunc(RDL_ERROR, "ring 'r' found without 'p' definition for rings!\n");
        error = 1;
      }
      else {
        stage = 2;
        if (sscanf(line, "r %u %u %u %u", &ring, &ring_size, &node1, &node2) != 4) {
          RDL_outputFunc(RDL_ERROR, "invalid ring specification line\n");
          error = 1;
        }
        else if (ring < 1|| ring > graph->nof_cycles) {
          RDL_outputFunc(RDL_ERROR, "invalid ring counter '%u'!\n", ring);
          error = 1;
        }
        else if (node1 < 1 || node1 > graph->nof_nodes || node2 < 1 || node2 > graph->nof_nodes) {
          RDL_outputFunc(RDL_ERROR, "illegal edge specification!\n");
          error = 1;
        }
        else {
          if (ring != last_ring) {
            if (last_ring) {
              if (ring_position_counter != graph->cycles[last_ring-1]->weight) {
                RDL_outputFunc(RDL_ERROR, "last ring %u wasn't filled up!\n", last_ring);
                error = 1;
              }
              else if (ring != last_ring + 1) {
                RDL_outputFunc(RDL_ERROR, "rings have to be continuous, '%u' follows on '%u'", ring, last_ring);
                error = 1;
              }
            }

            ring_position_counter = 0;
            graph->cycles[ring-1] = malloc(sizeof(**graph->cycles));
            graph->cycles[ring-1]->weight = ring_size;
            graph->cycles[ring-1]->edges = malloc(ring_size * sizeof(*graph->cycles[ring-1]->edges));
            last_ring = ring;
            ++ring_counter;
          }

          if (ring_position_counter == graph->cycles[ring-1]->weight) {
            RDL_outputFunc(RDL_ERROR, "too many edges for ring!\n");
            error = 1;
          }
          else {
            graph->cycles[ring-1]->edges[ring_position_counter][0] = node1;
            graph->cycles[ring-1]->edges[ring_position_counter][1] = node2;
            ++ring_position_counter;
          }
        }
      }
    }
    else if (line[0] == 'c') {
      len = strlen(line);
      if (!graph->name && len > 3) {
        /* skip first two characters (but reserve +1 for \0 and -1 for the newline) */
        graph->name = malloc((len - 2) * sizeof(*graph->name));
        strncpy(graph->name, line + 2, len - 3);
        graph->name[len - 3] = '\0';
      }
    }
    else {
      RDL_outputFunc(RDL_ERROR, "invalid line!\n");
      error = 1;
    }
  }

  if (!error && graph->nof_cycles != UINT_MAX) {
    if (ring_counter != graph->nof_cycles) {
      RDL_outputFunc(RDL_ERROR, "mismatch between number of cycles!\n");
      error = 1;
    }

    if (last_ring) {
      if (ring_position_counter != graph->cycles[last_ring-1]->weight) {
        RDL_outputFunc(RDL_ERROR, "last ring %u wasn't filled up!\n", last_ring);
        error = 1;
      }
    }
  }

  if (!error && edge_counter != graph->nof_edges) {
    RDL_outputFunc(RDL_ERROR, "mismatch between number of edges!\n");
    error = 1;
  }

  if (error && graph) {
    RDL_dimacsGraph_delete(graph);
    graph = NULL;
  }

  fclose(infile);

  if (!error) {
    if (graph->cycles) {
      graph->sorted_cycles = malloc(graph->nof_cycles * sizeof(*graph->sorted_cycles));
      for (ring_idx = 0; ring_idx < graph->nof_cycles; ++ring_idx) {
        graph->sorted_cycles[ring_idx] = malloc((graph->nof_edges + 1) * sizeof(**graph->sorted_cycles));
        memset(graph->sorted_cycles[ring_idx], 0, graph->nof_edges * sizeof(**graph->sorted_cycles));
        graph->sorted_cycles[ring_idx][graph->nof_edges] = 2;
        for (edge_idx = 0; edge_idx < graph->cycles[ring_idx]->weight; ++edge_idx) {
          edge[0] = graph->cycles[ring_idx]->edges[edge_idx][0];
          edge[1] = graph->cycles[ring_idx]->edges[edge_idx][1];
          for (eidx = 0; eidx < graph->nof_edges; ++eidx) {
            if ((graph->edges[eidx][0] == edge[0]&& graph->edges[eidx][1] == edge[1])
                || (graph->edges[eidx][0] == edge[1] && graph->edges[eidx][1] == edge[0])) {
              found_eidx = eidx;
            }
          }
          graph->sorted_cycles[ring_idx][found_eidx] = 1;
        }
      }

      qsort(graph->sorted_cycles, graph->nof_cycles, sizeof(*graph->sorted_cycles), RDL_cmp_cycles);
    }
    else {
      graph->sorted_cycles = NULL;
    }
  }

  return graph;
}